

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_codepage.cpp
# Opt level: O3

void test_pos<wchar_t>(string *source,
                      basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                      *target,string *encoding)

{
  string *psVar1;
  char *pcVar2;
  wchar_t *pwVar3;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar4;
  char *begin;
  wchar_t *begin_00;
  _Alloc_hider _Var5;
  int iVar6;
  ostream *poVar7;
  runtime_error *prVar8;
  method_type mVar9;
  char *pcVar10;
  string *psVar11;
  wchar_t *pwVar12;
  bool bVar13;
  locale l;
  generator g;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_60;
  string local_40 [8];
  generator local_38 [8];
  
  booster::locale::generator::generator(local_38);
  iVar6 = std::__cxx11::string::compare((char *)encoding);
  if (iVar6 == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60,
                   "he_IL.",encoding);
    booster::locale::generator::generate(local_40);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60,
                   "en_US.",encoding);
    booster::locale::generator::generate(local_40);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  test_counter = test_counter + 1;
  pcVar10 = (source->_M_dataplus)._M_p;
  mVar9 = (method_type)encoding;
  booster::locale::conv::to_utf<wchar_t>
            ((char *)&local_60,pcVar10,(string *)(pcVar10 + source->_M_string_length),mVar9);
  _Var5._M_p = local_60._M_dataplus._M_p;
  if (local_60._M_string_length == target->_M_string_length) {
    if (local_60._M_string_length == 0) {
      bVar13 = true;
    }
    else {
      iVar6 = wmemcmp(local_60._M_dataplus._M_p,(target->_M_dataplus)._M_p,local_60._M_string_length
                     );
      bVar13 = iVar6 == 0;
    }
  }
  else {
    bVar13 = false;
  }
  paVar4 = &local_60.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var5._M_p != paVar4) {
    operator_delete(_Var5._M_p);
  }
  if (!bVar13) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xb5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," to_utf<Char>(source,encoding)==target",0x26);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar6 = error_counter + 1;
    bVar13 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar13) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_60._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar8,(string *)&local_60);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pcVar10 = (source->_M_dataplus)._M_p;
  psVar11 = (string *)(pcVar10 + -1);
  do {
    psVar1 = psVar11 + 1;
    psVar11 = psVar11 + 1;
  } while (*psVar1 != (string)0x0);
  booster::locale::conv::to_utf<wchar_t>((char *)&local_60,pcVar10,psVar11,mVar9);
  _Var5._M_p = local_60._M_dataplus._M_p;
  if (local_60._M_string_length == target->_M_string_length) {
    if (local_60._M_string_length == 0) {
      bVar13 = true;
    }
    else {
      iVar6 = wmemcmp(local_60._M_dataplus._M_p,(target->_M_dataplus)._M_p,local_60._M_string_length
                     );
      bVar13 = iVar6 == 0;
    }
  }
  else {
    bVar13 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var5._M_p != paVar4) {
    operator_delete(_Var5._M_p);
  }
  if (!bVar13) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xb6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," to_utf<Char>(source.c_str(),encoding)==target",0x2e);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar6 = error_counter + 1;
    bVar13 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar13) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_60._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar8,(string *)&local_60);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pcVar10 = (source->_M_dataplus)._M_p;
  booster::locale::conv::to_utf<wchar_t>
            ((char *)&local_60,pcVar10,(string *)(pcVar10 + source->_M_string_length),mVar9);
  _Var5._M_p = local_60._M_dataplus._M_p;
  if (local_60._M_string_length == target->_M_string_length) {
    if (local_60._M_string_length == 0) {
      bVar13 = true;
    }
    else {
      iVar6 = wmemcmp(local_60._M_dataplus._M_p,(target->_M_dataplus)._M_p,local_60._M_string_length
                     );
      bVar13 = iVar6 == 0;
    }
  }
  else {
    bVar13 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var5._M_p != paVar4) {
    operator_delete(_Var5._M_p);
  }
  if (!bVar13) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xb7);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," to_utf<Char>(source.c_str(),source.c_str()+source.size(),encoding)==target",
               0x4b);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar6 = error_counter + 1;
    bVar13 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar13) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_60._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar8,(string *)&local_60);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pcVar10 = (source->_M_dataplus)._M_p;
  booster::locale::conv::to_utf<wchar_t>
            (&local_60,pcVar10,pcVar10 + source->_M_string_length,(locale *)local_40,default_method)
  ;
  _Var5._M_p = local_60._M_dataplus._M_p;
  if (local_60._M_string_length == target->_M_string_length) {
    if (local_60._M_string_length == 0) {
      bVar13 = true;
    }
    else {
      iVar6 = wmemcmp(local_60._M_dataplus._M_p,(target->_M_dataplus)._M_p,local_60._M_string_length
                     );
      bVar13 = iVar6 == 0;
    }
  }
  else {
    bVar13 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var5._M_p != paVar4) {
    operator_delete(_Var5._M_p);
  }
  if (!bVar13) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xb9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," to_utf<Char>(source,l)==target",0x1f);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar6 = error_counter + 1;
    bVar13 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar13) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_60._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar8,(string *)&local_60);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  begin = (source->_M_dataplus)._M_p;
  pcVar10 = begin + -1;
  do {
    pcVar2 = pcVar10 + 1;
    pcVar10 = pcVar10 + 1;
  } while (*pcVar2 != '\0');
  booster::locale::conv::to_utf<wchar_t>(&local_60,begin,pcVar10,(locale *)local_40,default_method);
  _Var5._M_p = local_60._M_dataplus._M_p;
  if (local_60._M_string_length == target->_M_string_length) {
    if (local_60._M_string_length == 0) {
      bVar13 = true;
    }
    else {
      iVar6 = wmemcmp(local_60._M_dataplus._M_p,(target->_M_dataplus)._M_p,local_60._M_string_length
                     );
      bVar13 = iVar6 == 0;
    }
  }
  else {
    bVar13 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var5._M_p != paVar4) {
    operator_delete(_Var5._M_p);
  }
  if (!bVar13) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xba);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," to_utf<Char>(source.c_str(),l)==target",0x27);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar6 = error_counter + 1;
    bVar13 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar13) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_60._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar8,(string *)&local_60);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pcVar10 = (source->_M_dataplus)._M_p;
  booster::locale::conv::to_utf<wchar_t>
            (&local_60,pcVar10,pcVar10 + source->_M_string_length,(locale *)local_40,default_method)
  ;
  _Var5._M_p = local_60._M_dataplus._M_p;
  if (local_60._M_string_length == target->_M_string_length) {
    if (local_60._M_string_length == 0) {
      bVar13 = true;
    }
    else {
      iVar6 = wmemcmp(local_60._M_dataplus._M_p,(target->_M_dataplus)._M_p,local_60._M_string_length
                     );
      bVar13 = iVar6 == 0;
    }
  }
  else {
    bVar13 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var5._M_p != paVar4) {
    operator_delete(_Var5._M_p);
  }
  if (!bVar13) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xbb);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," to_utf<Char>(source.c_str(),source.c_str()+source.size(),l)==target",0x44);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar6 = error_counter + 1;
    bVar13 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar13) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_60._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar8,(string *)&local_60);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pwVar12 = (target->_M_dataplus)._M_p;
  booster::locale::conv::from_utf<wchar_t>
            ((wchar_t *)&local_60,pwVar12,(string *)(pwVar12 + target->_M_string_length),mVar9);
  _Var5._M_p = local_60._M_dataplus._M_p;
  if (local_60._M_string_length == source->_M_string_length) {
    if (local_60._M_string_length == 0) {
      bVar13 = true;
    }
    else {
      iVar6 = bcmp(local_60._M_dataplus._M_p,(source->_M_dataplus)._M_p,local_60._M_string_length);
      bVar13 = iVar6 == 0;
    }
  }
  else {
    bVar13 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var5._M_p != paVar4) {
    operator_delete(_Var5._M_p);
  }
  if (!bVar13) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xbd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," from_utf<Char>(target,encoding)==source",0x28);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar6 = error_counter + 1;
    bVar13 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar13) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_60._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar8,(string *)&local_60);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pwVar12 = (target->_M_dataplus)._M_p;
  psVar11 = (string *)(pwVar12 + -1);
  do {
    psVar1 = psVar11 + 4;
    psVar11 = psVar11 + 4;
  } while (*(int *)psVar1 != 0);
  booster::locale::conv::from_utf<wchar_t>((wchar_t *)&local_60,pwVar12,psVar11,mVar9);
  _Var5._M_p = local_60._M_dataplus._M_p;
  if (local_60._M_string_length == source->_M_string_length) {
    if (local_60._M_string_length == 0) {
      bVar13 = true;
    }
    else {
      iVar6 = bcmp(local_60._M_dataplus._M_p,(source->_M_dataplus)._M_p,local_60._M_string_length);
      bVar13 = iVar6 == 0;
    }
  }
  else {
    bVar13 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var5._M_p != paVar4) {
    operator_delete(_Var5._M_p);
  }
  if (!bVar13) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xbe);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," from_utf<Char>(target.c_str(),encoding)==source",0x30);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar6 = error_counter + 1;
    bVar13 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar13) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_60._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar8,(string *)&local_60);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pwVar12 = (target->_M_dataplus)._M_p;
  booster::locale::conv::from_utf<wchar_t>
            ((wchar_t *)&local_60,pwVar12,(string *)(pwVar12 + target->_M_string_length),mVar9);
  _Var5._M_p = local_60._M_dataplus._M_p;
  if (local_60._M_string_length == source->_M_string_length) {
    if (local_60._M_string_length == 0) {
      bVar13 = true;
    }
    else {
      iVar6 = bcmp(local_60._M_dataplus._M_p,(source->_M_dataplus)._M_p,local_60._M_string_length);
      bVar13 = iVar6 == 0;
    }
  }
  else {
    bVar13 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var5._M_p != paVar4) {
    operator_delete(_Var5._M_p);
  }
  if (!bVar13) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xbf);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               " from_utf<Char>(target.c_str(),target.c_str()+target.size(),encoding)==source",0x4d)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar6 = error_counter + 1;
    bVar13 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar13) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_60._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar8,(string *)&local_60);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pwVar12 = (target->_M_dataplus)._M_p;
  booster::locale::conv::from_utf<wchar_t>
            ((string *)&local_60,pwVar12,pwVar12 + target->_M_string_length,(locale *)local_40,
             default_method);
  _Var5._M_p = local_60._M_dataplus._M_p;
  if (local_60._M_string_length == source->_M_string_length) {
    if (local_60._M_string_length == 0) {
      bVar13 = true;
    }
    else {
      iVar6 = bcmp(local_60._M_dataplus._M_p,(source->_M_dataplus)._M_p,local_60._M_string_length);
      bVar13 = iVar6 == 0;
    }
  }
  else {
    bVar13 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var5._M_p != paVar4) {
    operator_delete(_Var5._M_p);
  }
  if (!bVar13) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," from_utf<Char>(target,l)==source",0x21);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar6 = error_counter + 1;
    bVar13 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar13) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_60._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar8,(string *)&local_60);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  begin_00 = (target->_M_dataplus)._M_p;
  pwVar12 = begin_00 + -1;
  do {
    pwVar3 = pwVar12 + 1;
    pwVar12 = pwVar12 + 1;
  } while (*pwVar3 != L'\0');
  booster::locale::conv::from_utf<wchar_t>
            ((string *)&local_60,begin_00,pwVar12,(locale *)local_40,default_method);
  _Var5._M_p = local_60._M_dataplus._M_p;
  if (local_60._M_string_length == source->_M_string_length) {
    if (local_60._M_string_length == 0) {
      bVar13 = true;
    }
    else {
      iVar6 = bcmp(local_60._M_dataplus._M_p,(source->_M_dataplus)._M_p,local_60._M_string_length);
      bVar13 = iVar6 == 0;
    }
  }
  else {
    bVar13 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var5._M_p != paVar4) {
    operator_delete(_Var5._M_p);
  }
  if (!bVar13) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," from_utf<Char>(target.c_str(),l)==source",0x29);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar6 = error_counter + 1;
    bVar13 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar13) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_60._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar8,(string *)&local_60);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pwVar12 = (target->_M_dataplus)._M_p;
  booster::locale::conv::from_utf<wchar_t>
            ((string *)&local_60,pwVar12,pwVar12 + target->_M_string_length,(locale *)local_40,
             default_method);
  if (local_60._M_string_length == source->_M_string_length) {
    if (local_60._M_string_length == 0) {
      bVar13 = true;
    }
    else {
      iVar6 = bcmp(local_60._M_dataplus._M_p,(source->_M_dataplus)._M_p,local_60._M_string_length);
      bVar13 = iVar6 == 0;
    }
  }
  else {
    bVar13 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_60._M_dataplus._M_p != paVar4) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (!bVar13) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," from_utf<Char>(target.c_str(),target.c_str()+target.size(),l)==source",0x46)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar6 = error_counter + 1;
    bVar13 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar13) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_60._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar8,(string *)&local_60);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::locale::~locale((locale *)local_40);
  booster::locale::generator::~generator(local_38);
  return;
}

Assistant:

void test_pos(std::string source,std::basic_string<Char> target,std::string encoding)
{
    using namespace booster::locale::conv;
    booster::locale::generator g;
    std::locale l= encoding == "ISO8859-8" ? g("he_IL."+encoding) : g("en_US."+encoding);
    TEST(to_utf<Char>(source,encoding)==target);
    TEST(to_utf<Char>(source.c_str(),encoding)==target);
    TEST(to_utf<Char>(source.c_str(),source.c_str()+source.size(),encoding)==target);
    
    TEST(to_utf<Char>(source,l)==target);
    TEST(to_utf<Char>(source.c_str(),l)==target);
    TEST(to_utf<Char>(source.c_str(),source.c_str()+source.size(),l)==target);

    TEST(from_utf<Char>(target,encoding)==source);
    TEST(from_utf<Char>(target.c_str(),encoding)==source);
    TEST(from_utf<Char>(target.c_str(),target.c_str()+target.size(),encoding)==source);
    
    TEST(from_utf<Char>(target,l)==source);
    TEST(from_utf<Char>(target.c_str(),l)==source);
    TEST(from_utf<Char>(target.c_str(),target.c_str()+target.size(),l)==source);
}